

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O1

pboolean p_socket_listen(PSocket *socket,PError **error)

{
  int iVar1;
  
  if (socket == (PSocket *)0x0) {
    p_socket_listen_cold_3();
  }
  else if ((socket->field_0x18 & 4) == 0) {
    iVar1 = listen(socket->fd,socket->listen_backlog);
    if (-1 < iVar1) {
      socket->field_0x18 = socket->field_0x18 | 0x10;
      return 1;
    }
    p_socket_listen_cold_2();
  }
  else {
    p_socket_listen_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_listen (PSocket	*socket,
		 PError		**error)
{
	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (P_UNLIKELY (listen (socket->fd, socket->listen_backlog) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call listen() on socket");
		return FALSE;
	}

	socket->listening = TRUE;
	return TRUE;
}